

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w)

{
  uint nrows;
  uint ncols;
  CUPDLPproblem *problem;
  CUPDLPdata *pCVar1;
  cupdlp_retcode cVar2;
  CUPDLPsettings *pCVar3;
  CUPDLPresobj *pCVar4;
  CUPDLPiterates *pCVar5;
  CUPDLPstepsize *pCVar6;
  CUPDLPtimers *pCVar7;
  CUPDLPvec *pCVar8;
  cupdlp_float *pcVar9;
  cupdlp_retcode cVar10;
  uint uVar11;
  size_t sVar12;
  
  pCVar3 = (CUPDLPsettings *)malloc(0x48);
  w->settings = pCVar3;
  cVar10 = 1;
  if (pCVar3 != (CUPDLPsettings *)0x0) {
    pCVar4 = (CUPDLPresobj *)malloc(0x188);
    w->resobj = pCVar4;
    if (pCVar4 != (CUPDLPresobj *)0x0) {
      pCVar5 = (CUPDLPiterates *)malloc(0xa0);
      w->iterates = pCVar5;
      if (pCVar5 != (CUPDLPiterates *)0x0) {
        pCVar6 = (CUPDLPstepsize *)malloc(0x40);
        w->stepsize = pCVar6;
        if (pCVar6 != (CUPDLPstepsize *)0x0) {
          pCVar7 = (CUPDLPtimers *)malloc(0x58);
          w->timers = pCVar7;
          if (pCVar7 != (CUPDLPtimers *)0x0) {
            pCVar7->nIter = 0;
            pCVar7->dSolvingTime = 0.0;
            pCVar7->dSolvingBeg = 0.0;
            pCVar7->dScalingTime = 0.0;
            pCVar7->dPresolveTime = 0.0;
            pCVar7->dAtyTime = 0.0;
            pCVar7->dAxTime = 0.0;
            pCVar7->dComputeResidualsTime = 0.0;
            pCVar7->dUpdateIterateTime = 0.0;
            pCVar7->nAtyCalls = 0;
            pCVar7->nAxCalls = 0;
            pCVar7->nComputeResidualsCalls = 0;
            pCVar7->nUpdateIterateCalls = 0;
            time((time_t *)0x0);
            pCVar8 = (CUPDLPvec *)malloc(0x10);
            w->buffer = pCVar8;
            if (pCVar8 != (CUPDLPvec *)0x0) {
              problem = w->problem;
              pCVar1 = problem->data;
              nrows = pCVar1->nRows;
              pcVar9 = (cupdlp_float *)calloc((long)(int)nrows,8);
              pCVar8->data = pcVar9;
              if (pcVar9 != (cupdlp_float *)0x0) {
                pCVar8->len = nrows;
                ncols = pCVar1->nCols;
                uVar11 = nrows;
                if ((int)nrows < (int)ncols) {
                  uVar11 = ncols;
                }
                sVar12 = 0x800;
                if (0x800 < (int)uVar11) {
                  sVar12 = (size_t)uVar11;
                }
                pcVar9 = (cupdlp_float *)calloc(sVar12,8);
                w->buffer2 = pcVar9;
                if (pcVar9 != (cupdlp_float *)0x0) {
                  sVar12 = 0x800;
                  if (0x800 < (int)uVar11) {
                    sVar12 = (size_t)uVar11;
                  }
                  pcVar9 = (cupdlp_float *)calloc(sVar12,8);
                  w->buffer3 = pcVar9;
                  if (pcVar9 != (cupdlp_float *)0x0) {
                    pcVar9 = (cupdlp_float *)calloc((long)(int)ncols,8);
                    w->colScale = pcVar9;
                    if (pcVar9 != (cupdlp_float *)0x0) {
                      pcVar9 = (cupdlp_float *)calloc((long)(int)nrows,8);
                      w->rowScale = pcVar9;
                      if (pcVar9 != (cupdlp_float *)0x0) {
                        pCVar3 = w->settings;
                        pCVar3->nLogLevel = 2;
                        pCVar3->nLogInterval = 100;
                        pCVar3->dTimeLim = 3600.0;
                        pCVar3->ifScaling = 1;
                        pCVar3->iScalingMethod = 3;
                        pCVar3->eRestartMethod = PDHG_GPU_RESTART;
                        pCVar3->iInfNormAbsLocalTermination = 0;
                        pCVar3->nIterLim = 0x7fffffff;
                        pCVar3->dScalingLimit = 5.0;
                        pCVar3->dPrimalTol = 0.0001;
                        pCVar3->dDualTol = 0.0001;
                        pCVar3->dGapTol = 0.0001;
                        cVar2 = resobj_Alloc(w->resobj,problem,ncols,nrows);
                        if (cVar2 == 0) {
                          pCVar1 = w->problem->data;
                          cVar2 = iterates_Alloc(w->iterates,pCVar1->nCols,pCVar1->nRows);
                          if (cVar2 == 0) {
                            pCVar6 = w->stepsize;
                            pCVar6->eLineSearchMethod = PDHG_ADAPTIVE_LINESEARCH;
                            pCVar6->dPrimalStep = 0.0;
                            pCVar6->dDualStep = 0.0;
                            pCVar6->dSumPrimalStep = 0.0;
                            pCVar6->dSumDualStep = 0.0;
                            pCVar6->dBeta = 0.0;
                            pCVar6->dTheta = 0.0;
                            pCVar6->nStepSizeIter = 0;
                            cVar10 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar10;
}

Assistant:

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLP_INIT_SETTINGS(w->settings, 1);
  CUPDLP_INIT_RESOBJ(w->resobj, 1);
  CUPDLP_INIT_ITERATES(w->iterates, 1);
  CUPDLP_INIT_STEPSIZE(w->stepsize, 1);

  CUPDLP_INIT_TIMERS(w->timers, 1);
  CUPDLP_CALL(timers_Alloc(w->timers));

  cupdlp_float begin = getTimeStamp();
  // buffer
  CUPDLP_INIT_CUPDLP_VEC(w->buffer, 1);
  CUPDLP_CALL(vec_Alloc(w->buffer, w->problem->data->nRows));


  cupdlp_init_zero_vec_double(w->buffer2,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#if defined(CUPDLP_CPU) || !(USE_KERNELS) || (CUPDLP_DUMP_LINESEARCH_STATS && CUPDLP_DEBUG)
  cupdlp_init_zero_vec_double(w->buffer3,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#else
  w->buffer3 = NULL;
#endif

  // for scaling
  cupdlp_init_zero_vec_double(w->colScale, w->problem->data->nCols);
  cupdlp_init_zero_vec_double(w->rowScale, w->problem->data->nRows);

  CUPDLP_CALL(settings_Alloc(w->settings));
  CUPDLP_CALL(resobj_Alloc(w->resobj, w->problem, w->problem->data->nCols,
                           w->problem->data->nRows));
  CUPDLP_CALL(iterates_Alloc(w->iterates, w->problem->data->nCols,
                             w->problem->data->nRows));
  CUPDLP_CALL(stepsize_Alloc(w->stepsize));

#ifndef CUPDLP_CPU
  //   CHECK_CUSPARSE(cusparseCreate(&w->cusparsehandle));
  //   CHECK_CUBLAS(cublasCreate(&w->cublashandle));
  CUPDLP_CALL(cuda_alloc_MVbuffer(
      //   w->problem->data->matrix_format,
      w->cusparsehandle, w->problem->data->csc_matrix->cuda_csc,
      w->iterates->x[0]->cuda_vec, w->iterates->ax[0]->cuda_vec,
      w->problem->data->csr_matrix->cuda_csr, w->iterates->y[0]->cuda_vec,
      w->iterates->aty[0]->cuda_vec, &w->dBuffer_csc_ATy, &w->dBuffer_csr_Ax))
  w->timers->AllocMem_CopyMatToDeviceTime += getTimeStamp() - begin;
#endif

exit_cleanup:
  return retcode;
}